

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Error PVG_FT_Stroker_BeginSubPath(PVG_FT_Stroker stroker,PVG_FT_Vector *to,PVG_FT_Bool open)

{
  bool local_1b;
  bool local_1a;
  PVG_FT_Bool open_local;
  PVG_FT_Vector *to_local;
  PVG_FT_Stroker stroker_local;
  
  stroker->first_point = '\x01';
  (stroker->center).x = to->x;
  (stroker->center).y = to->y;
  stroker->subpath_open = open;
  local_1a = true;
  if (stroker->line_join == PVG_FT_STROKER_LINEJOIN_ROUND) {
    local_1b = false;
    if (stroker->subpath_open != '\0') {
      local_1b = stroker->line_cap == PVG_FT_STROKER_LINECAP_BUTT;
    }
    local_1a = local_1b;
  }
  stroker->handle_wide_strokes = local_1a;
  (stroker->subpath_start).x = to->x;
  (stroker->subpath_start).y = to->y;
  stroker->angle_in = 0;
  return 0;
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_BeginSubPath(PVG_FT_Stroker stroker, PVG_FT_Vector* to,
                                       PVG_FT_Bool open)
{
    /* We cannot process the first point, because there is not enough      */
    /* information regarding its corner/cap.  The latter will be processed */
    /* in the `PVG_FT_Stroker_EndSubPath' routine.                             */
    /*                                                                     */
    stroker->first_point = TRUE;
    stroker->center = *to;
    stroker->subpath_open = open;

    /* Determine if we need to check whether the border radius is greater */
    /* than the radius of curvature of a curve, to handle this case       */
    /* specially.  This is only required if bevel joins or butt caps may  */
    /* be created, because round & miter joins and round & square caps    */
    /* cover the negative sector created with wide strokes.               */
    stroker->handle_wide_strokes =
        PVG_FT_BOOL(stroker->line_join != PVG_FT_STROKER_LINEJOIN_ROUND ||
                   (stroker->subpath_open &&
                    stroker->line_cap == PVG_FT_STROKER_LINECAP_BUTT));

    /* record the subpath start point for each border */
    stroker->subpath_start = *to;

    stroker->angle_in = 0;

    return 0;
}